

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Font::toString_abi_cxx11_(string *__return_storage_ptr__,Font *this,Layout *layout)

{
  ostream *poVar1;
  string *in_R8;
  stringstream ss;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  double local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string((string *)&local_1e0,"font-size",&local_269);
  local_268 = this->size * layout->scale;
  std::__cxx11::string::string((string *)&local_200,"",&local_26a);
  attribute<double>(&local_1c0,&local_1e0,&local_268,&local_200);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::string(local_240,"font-family",&local_26b);
  std::__cxx11::string::string((string *)&local_260,"",&local_26c);
  attribute<std::__cxx11::string>(&local_220,(svg *)local_240,&this->family,&local_260,in_R8);
  std::operator<<(poVar1,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("font-size", translateScale(size, layout)) << attribute("font-family", family);
            return ss.str();
        }